

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_decompose.hpp
# Opt level: O0

lest * __thiscall lest::make_string<C>(lest *this,C *ptr)

{
  _Setfill<char> _Var1;
  _Setw _Var2;
  void *pvVar3;
  ostream *poVar4;
  ostringstream local_190 [8];
  ostringstream os;
  C *ptr_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  pvVar3 = (void *)std::ostream::operator<<(local_190,std::internal);
  pvVar3 = (void *)std::ostream::operator<<(pvVar3,std::hex);
  poVar4 = (ostream *)std::ostream::operator<<(pvVar3,std::showbase);
  _Var2 = std::setw(0x12);
  poVar4 = std::operator<<(poVar4,_Var2);
  _Var1 = std::setfill<char>('0');
  poVar4 = std::operator<<(poVar4,_Var1._M_c);
  std::ostream::operator<<(poVar4,(long)ptr);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return this;
}

Assistant:

inline std::string make_string( T const * ptr )
{
    // Note showbase affects the behavior of /integer/ output;
    std::ostringstream os;
    os << std::internal << std::hex << std::showbase << std::setw( 2 + 2 * sizeof(T*) ) << std::setfill('0') << reinterpret_cast<std::ptrdiff_t>( ptr );
    return os.str();
}